

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_bias(uint16_t *out,uint16_t *in,uint bias,uint p,uint q)

{
  uint16_t uVar1;
  ulong uVar2;
  
  for (uVar2 = 0; p != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = reduce(in[uVar2] + bias,(uint16_t)q,
                   SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0));
    out[uVar2] = uVar1;
  }
  return;
}

Assistant:

void ntru_bias(uint16_t *out, const uint16_t *in, unsigned bias,
               unsigned p, unsigned q)
{
    SETUP;
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias);
}